

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O1

void duckdb::NumericStats::Deserialize(Deserializer *deserializer,BaseStatistics *result)

{
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"max");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  DeserializeNumericStatsValue
            (&result->type,&(result->stats_union).numeric_data.min,(bool *)&result->stats_union,
             deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"min");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  DeserializeNumericStatsValue
            (&result->type,&(result->stats_union).numeric_data.max,
             &(result->stats_union).numeric_data.has_max,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  return;
}

Assistant:

void NumericStats::Deserialize(Deserializer &deserializer, BaseStatistics &result) {
	auto &numeric_stats = NumericStats::GetDataUnsafe(result);

	deserializer.ReadObject(200, "max", [&](Deserializer &object) {
		DeserializeNumericStatsValue(result.GetType(), numeric_stats.min, numeric_stats.has_min, object);
	});
	deserializer.ReadObject(201, "min", [&](Deserializer &object) {
		DeserializeNumericStatsValue(result.GetType(), numeric_stats.max, numeric_stats.has_max, object);
	});
}